

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QString>::resize_impl
          (QVLABase<QString> *this,qsizetype prealloc,void *array,qsizetype sz,QString *v)

{
  bool bVar1;
  iterator pQVar2;
  iterator pQVar3;
  size_type sVar4;
  QString *args;
  long in_RCX;
  qsizetype in_RDX;
  QString *in_RSI;
  QVLABaseBase *in_RDI;
  QVLABase<QString> *in_R8;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffffa8;
  QVLABase<QString> *array_00;
  size_type local_30 [3];
  qsizetype in_stack_ffffffffffffffe8;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  array_00 = in_R8;
  local_10 = in_RCX;
  pQVar2 = begin((QVLABase<QString> *)0x2b6a01);
  pQVar3 = end((QVLABase<QString> *)in_stack_ffffffffffffff60);
  bVar1 = QtPrivate::q_points_into_range<QString,std::less<void>>(in_R8,pQVar2,pQVar3);
  if (bVar1) {
    QString::QString(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    resize_impl((QVLABase<QString> *)in_RSI,in_RDX,array_00,in_stack_ffffffffffffffe8,
                in_stack_ffffffffffffffa8);
    QString::~QString((QString *)0x2b6a89);
  }
  else {
    local_30[0] = QVLABaseBase::capacity(in_RDI);
    qMax<long_long>(&local_10,local_30);
    reallocate_impl(in_R8,(qsizetype)in_RDI,in_stack_ffffffffffffff88,in_RDX,(qsizetype)array_00);
    while( true ) {
      sVar4 = QVLABaseBase::size(in_RDI);
      if (local_10 <= sVar4) break;
      args = data((QVLABase<QString> *)in_RDI);
      QVLABaseBase::size(in_RDI);
      q20::construct_at<QString,QString_const&,void>(in_RSI,args);
      in_RDI->s = in_RDI->s + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz, const T &v)
    {
        if (QtPrivate::q_points_into_range(&v, begin(), end())) {
            resize_impl(prealloc, array, sz, T(v));
            return;
        }
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        while (size() < sz) {
            q20::construct_at(data() + size(), v);
            ++s;
        }
    }